

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

TEXTURE_FORMAT __thiscall
Diligent::VkFormatToTexFormatMapper::operator[](VkFormatToTexFormatMapper *this,VkFormat VkFmt)

{
  bool bVar1;
  pointer pvVar2;
  TEXTURE_FORMAT local_3a;
  _Node_iterator_base<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>,_true> local_30;
  _Node_iterator_base<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>,_true> local_28;
  const_iterator it;
  VkFormat VkFmt_local;
  VkFormatToTexFormatMapper *this_local;
  
  if ((int)VkFmt < 0xb9) {
    this_local._6_2_ = this->m_VkFmtToTexFmtMap[VkFmt];
  }
  else {
    it.super__Node_iterator_base<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>,_true>._M_cur.
    _4_4_ = VkFmt;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
         ::find(&this->m_VkFmtToTexFmtMapExt,
                (key_type *)
                ((long)&it.
                        super__Node_iterator_base<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>,_true>
                        ._M_cur + 4));
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
         ::end(&this->m_VkFmtToTexFmtMapExt);
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>,_false,_true>
                             *)&local_28);
      local_3a = pvVar2->second;
    }
    else {
      local_3a = TEX_FORMAT_UNKNOWN;
    }
    this_local._6_2_ = local_3a;
  }
  return this_local._6_2_;
}

Assistant:

TEXTURE_FORMAT operator[](VkFormat VkFmt) const
    {
        if (VkFmt < VK_FORMAT_RANGE_SIZE)
        {
            return m_VkFmtToTexFmtMap[VkFmt];
        }
        else
        {
            auto it = m_VkFmtToTexFmtMapExt.find(VkFmt);
            return it != m_VkFmtToTexFmtMapExt.end() ? it->second : TEX_FORMAT_UNKNOWN;
        }
    }